

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::~SimpleQueue
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  mutex_type *in_stack_ffffffffffffffd8;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_fffffffffffffff0;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5614a2);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5614b0);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5614ba);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5614c4);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (in_stack_fffffffffffffff0);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (in_stack_fffffffffffffff0);
  return;
}

Assistant:

~SimpleQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            /** clear the elements as part of the destruction while the locks
             * are engaged*/
            pushElements.clear();
            pullElements.clear();
        }